

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# version_set.cc
# Opt level: O0

Status __thiscall leveldb::VersionSet::WriteSnapshot(VersionSet *this,Writer *log)

{
  bool bVar1;
  int iVar2;
  Comparator *pCVar3;
  undefined4 extraout_var;
  InternalKey *pIVar4;
  Slice *in_RDX;
  VersionEdit *in_RSI;
  VersionEdit *in_RDI;
  long in_FS_OFFSET;
  FileMetaData *f;
  size_t i;
  vector<leveldb::FileMetaData_*,_std::allocator<leveldb::FileMetaData_*>_> *files;
  int level_1;
  int level;
  string record;
  InternalKey key;
  VersionEdit edit;
  VersionEdit *in_stack_fffffffffffffe48;
  string *in_stack_fffffffffffffe50;
  VersionEdit *in_stack_fffffffffffffe58;
  Slice *in_stack_fffffffffffffe60;
  InternalKey *in_stack_fffffffffffffe68;
  InternalKey *largest;
  VersionEdit *file;
  InternalKey *local_160;
  undefined4 in_stack_fffffffffffffeb0;
  int iVar5;
  undefined4 in_stack_fffffffffffffebc;
  Writer *in_stack_fffffffffffffec0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_f0 [7];
  long local_8;
  InternalKey *smallest;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  file = in_RDI;
  VersionEdit::VersionEdit(in_RDI);
  pCVar3 = InternalKeyComparator::user_comparator
                     ((InternalKeyComparator *)in_stack_fffffffffffffe48);
  iVar2 = (*pCVar3->_vptr_Comparator[3])();
  smallest = (InternalKey *)CONCAT44(extraout_var,iVar2);
  Slice::Slice((Slice *)in_stack_fffffffffffffe58,(char *)in_stack_fffffffffffffe50);
  VersionEdit::SetComparatorName(in_stack_fffffffffffffe58,(Slice *)in_stack_fffffffffffffe50);
  for (iVar2 = 0; iVar2 < 7; iVar2 = iVar2 + 1) {
    bVar1 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::empty
                      (&in_stack_fffffffffffffe48->comparator_);
    if (!bVar1) {
      InternalKey::InternalKey((InternalKey *)in_stack_fffffffffffffe48);
      Slice::Slice((Slice *)in_stack_fffffffffffffe58,in_stack_fffffffffffffe50);
      InternalKey::DecodeFrom(in_stack_fffffffffffffe68,in_stack_fffffffffffffe60);
      VersionEdit::SetCompactPointer(in_RDI,(int)((ulong)file >> 0x20),smallest);
      InternalKey::~InternalKey((InternalKey *)in_stack_fffffffffffffe48);
    }
  }
  for (iVar5 = 0; iVar5 < 7; iVar5 = iVar5 + 1) {
    local_160 = (InternalKey *)0x0;
    while( true ) {
      largest = local_160;
      pIVar4 = (InternalKey *)
               std::vector<leveldb::FileMetaData_*,_std::allocator<leveldb::FileMetaData_*>_>::size
                         ((vector<leveldb::FileMetaData_*,_std::allocator<leveldb::FileMetaData_*>_>
                           *)in_stack_fffffffffffffe48);
      if (pIVar4 <= largest) break;
      std::vector<leveldb::FileMetaData_*,_std::allocator<leveldb::FileMetaData_*>_>::operator[]
                ((vector<leveldb::FileMetaData_*,_std::allocator<leveldb::FileMetaData_*>_> *)
                 in_stack_fffffffffffffe58,(size_type)in_stack_fffffffffffffe50);
      VersionEdit::AddFile
                (in_RSI,(int)((ulong)pCVar3 >> 0x20),(uint64_t)file,(uint64_t)in_RDI,smallest,
                 largest);
      local_160 = (InternalKey *)((long)&(local_160->rep_)._M_dataplus._M_p + 1);
    }
  }
  std::__cxx11::string::string(local_f0);
  VersionEdit::EncodeTo
            ((VersionEdit *)CONCAT44(in_stack_fffffffffffffebc,iVar2),
             (string *)CONCAT44(iVar5,in_stack_fffffffffffffeb0));
  Slice::Slice(in_RDX,in_stack_fffffffffffffe50);
  leveldb::log::Writer::AddRecord
            (in_stack_fffffffffffffec0,(Slice *)CONCAT44(in_stack_fffffffffffffebc,iVar2));
  std::__cxx11::string::~string(&in_stack_fffffffffffffe48->comparator_);
  VersionEdit::~VersionEdit(in_stack_fffffffffffffe48);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return (Status)(char *)file;
  }
  __stack_chk_fail();
}

Assistant:

Status VersionSet::WriteSnapshot(log::Writer* log) {
  // TODO: Break up into multiple records to reduce memory usage on recovery?

  // Save metadata
  VersionEdit edit;
  edit.SetComparatorName(icmp_.user_comparator()->Name());

  // Save compaction pointers
  for (int level = 0; level < config::kNumLevels; level++) {
    if (!compact_pointer_[level].empty()) {
      InternalKey key;
      key.DecodeFrom(compact_pointer_[level]);
      edit.SetCompactPointer(level, key);
    }
  }

  // Save files
  for (int level = 0; level < config::kNumLevels; level++) {
    const std::vector<FileMetaData*>& files = current_->files_[level];
    for (size_t i = 0; i < files.size(); i++) {
      const FileMetaData* f = files[i];
      edit.AddFile(level, f->number, f->file_size, f->smallest, f->largest);
    }
  }

  std::string record;
  edit.EncodeTo(&record);
  return log->AddRecord(record);
}